

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O0

void __thiscall
DIntermissionScreen::Init(DIntermissionScreen *this,FIntermissionAction *desc,bool first)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  FTextureID FVar6;
  char *pcVar7;
  ulong uVar8;
  FName *pFVar9;
  undefined4 extraout_var;
  FIntermissionPatch *pFVar10;
  FIIntermissionPatch *pFVar11;
  uint local_7c;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_78;
  uint i_1;
  undefined1 local_68 [20];
  int i;
  FMemLump lump;
  BYTE *orgpal;
  PalEntry *palette;
  int local_38;
  uint local_34;
  DWORD *pDStack_30;
  uint v;
  char *pp;
  char *texname;
  int lumpnum;
  bool first_local;
  FIntermissionAction *desc_local;
  DIntermissionScreen *this_local;
  
  texname._7_1_ = first;
  _lumpnum = desc;
  desc_local = (FIntermissionAction *)this;
  if ((desc->mCdTrack == 0) || (bVar2 = S_ChangeCDMusic(desc->mCdTrack,desc->mCdId,true), !bVar2)) {
    bVar2 = FString::IsEmpty(&_lumpnum->mMusic);
    if (bVar2) {
      if ((texname._7_1_ & 1) != 0) {
        pcVar7 = FString::operator_cast_to_char_(&gameinfo.finaleMusic);
        S_ChangeMusic(pcVar7,gameinfo.finaleOrder,(bool)(_lumpnum->mMusicLooping & 1),false);
      }
    }
    else {
      pcVar7 = FString::operator_cast_to_char_(&_lumpnum->mMusic);
      S_ChangeMusic(pcVar7,_lumpnum->mMusicOrder,(bool)(_lumpnum->mMusicLooping & 1),false);
    }
  }
  *(int *)&(this->super_DObject).field_0x24 = _lumpnum->mDuration;
  pp = FString::operator_cast_to_char_(&_lumpnum->mBackground);
  if (*pp == '@') {
    uVar8 = strtoul(pp + 1,(char **)&stack0xffffffffffffffd0,10);
    uVar3 = (int)uVar8 - 1;
    local_34 = uVar3;
    if (((char)*pDStack_30 == '\0') &&
       (uVar4 = TArray<FName,_FName>::Size(&gameinfo.finalePages), uVar3 < uVar4)) {
      pFVar9 = TArray<FName,_FName>::operator[](&gameinfo.finalePages,(ulong)local_34);
      pp = FName::GetChars(pFVar9);
    }
    else {
      uVar3 = TArray<FName,_FName>::Size(&gameinfo.finalePages);
      if (uVar3 == 0) {
        pp = FString::GetChars(&gameinfo.TitlePage);
      }
      else {
        pFVar9 = TArray<FName,_FName>::operator[](&gameinfo.finalePages,0);
        pp = FName::GetChars(pFVar9);
      }
    }
  }
  else if (*pp == '$') {
    pp = FStringTable::operator()(&GStrings,pp + 1);
  }
  if (*pp != '\0') {
    local_38 = (int)FTextureManager::CheckForTexture(&TexMan,pp,8,1);
    (this->mBackground).texnum = local_38;
    this->mFlatfill = (bool)(_lumpnum->mFlatfill & 1);
  }
  FSoundID::FSoundID((FSoundID *)((long)&palette + 4),&_lumpnum->mSound);
  S_Sound(0x22,(FSoundID *)((long)&palette + 4),1.0,0.0);
  bVar2 = FString::IsNotEmpty(&_lumpnum->mPalette);
  if ((bVar2) &&
     (texname._0_4_ = FWadCollection::CheckNumForFullName(&Wads,&_lumpnum->mPalette,true,0),
     0 < (int)texname)) {
    FMemLump::FMemLump((FMemLump *)(local_68 + 0x10));
    FWadCollection::ReadLump((FWadCollection *)local_68,0x1f756a0);
    FMemLump::operator=((FMemLump *)(local_68 + 0x10),(FMemLump *)local_68);
    FMemLump::~FMemLump((FMemLump *)local_68);
    lump.Block.Chars = (FString)FMemLump::GetMem((FMemLump *)(local_68 + 0x10));
    iVar5 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1a])();
    orgpal = (BYTE *)CONCAT44(extraout_var,iVar5);
    for (local_68._12_4_ = 0x100; 0 < (int)local_68._12_4_; local_68._12_4_ = local_68._12_4_ - 1) {
      PalEntry::PalEntry((PalEntry *)&local_78.field_0,*(BYTE *)lump.Block.Chars,
                         *(BYTE *)((long)lump.Block.Chars + 1),*(BYTE *)((long)lump.Block.Chars + 2)
                        );
      *(anon_union_4_2_12391d7c_for_PalEntry_0 *)orgpal = local_78;
      lump.Block.Chars = (FString)((long)lump.Block.Chars + 3);
      orgpal = orgpal + 4;
    }
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1c])();
    this->mPaletteChanged = true;
    NoWipe = 1;
    M_EnableMenu(false);
    FMemLump::~FMemLump((FMemLump *)(local_68 + 0x10));
  }
  uVar3 = TArray<FIntermissionPatch,_FIntermissionPatch>::Size(&_lumpnum->mOverlays);
  TArray<FIIntermissionPatch,_FIIntermissionPatch>::Resize(&this->mOverlays,uVar3);
  for (local_7c = 0;
      uVar3 = TArray<FIIntermissionPatch,_FIIntermissionPatch>::Size(&this->mOverlays),
      local_7c < uVar3; local_7c = local_7c + 1) {
    pFVar10 = TArray<FIntermissionPatch,_FIntermissionPatch>::operator[]
                        (&_lumpnum->mOverlays,(ulong)local_7c);
    dVar1 = pFVar10->x;
    pFVar11 = TArray<FIIntermissionPatch,_FIIntermissionPatch>::operator[]
                        (&this->mOverlays,(ulong)local_7c);
    pFVar11->x = dVar1;
    pFVar10 = TArray<FIntermissionPatch,_FIntermissionPatch>::operator[]
                        (&_lumpnum->mOverlays,(ulong)local_7c);
    dVar1 = pFVar10->y;
    pFVar11 = TArray<FIIntermissionPatch,_FIIntermissionPatch>::operator[]
                        (&this->mOverlays,(ulong)local_7c);
    pFVar11->y = dVar1;
    pFVar10 = TArray<FIntermissionPatch,_FIntermissionPatch>::operator[]
                        (&_lumpnum->mOverlays,(ulong)local_7c);
    pFVar11 = TArray<FIIntermissionPatch,_FIIntermissionPatch>::operator[]
                        (&this->mOverlays,(ulong)local_7c);
    FName::operator=(&pFVar11->mCondition,&pFVar10->mCondition);
    pFVar10 = TArray<FIntermissionPatch,_FIntermissionPatch>::operator[]
                        (&_lumpnum->mOverlays,(ulong)local_7c);
    pcVar7 = FString::operator_cast_to_char_(&pFVar10->mName);
    FVar6 = FTextureManager::CheckForTexture(&TexMan,pcVar7,8,1);
    pFVar11 = TArray<FIIntermissionPatch,_FIIntermissionPatch>::operator[]
                        (&this->mOverlays,(ulong)local_7c);
    (pFVar11->mPic).texnum = FVar6.texnum;
  }
  this->mTicker = 0;
  return;
}

Assistant:

void DIntermissionScreen::Init(FIntermissionAction *desc, bool first)
{
	int lumpnum;

	if (desc->mCdTrack == 0 || !S_ChangeCDMusic (desc->mCdTrack, desc->mCdId))
	{
		if (desc->mMusic.IsEmpty())
		{
			// only start the default music if this is the first action in an intermission
			if (first) S_ChangeMusic (gameinfo.finaleMusic, gameinfo.finaleOrder, desc->mMusicLooping);
		}
		else
		{
			S_ChangeMusic (desc->mMusic, desc->mMusicOrder, desc->mMusicLooping);
		}
	}
	mDuration = desc->mDuration;

	const char *texname = desc->mBackground;
	if (*texname == '@')
	{
		char *pp;
		unsigned int v = strtoul(texname+1, &pp, 10) - 1;
		if (*pp == 0 && v < gameinfo.finalePages.Size())
		{
			texname = gameinfo.finalePages[v].GetChars();
		}
		else if (gameinfo.finalePages.Size() > 0)
		{
			texname = gameinfo.finalePages[0].GetChars();
		}
		else
		{
			texname = gameinfo.TitlePage.GetChars();
		}
	}
	else if (*texname == '$')
	{
		texname = GStrings(texname+1);
	}
	if (texname[0] != 0)
	{
		mBackground = TexMan.CheckForTexture(texname, FTexture::TEX_MiscPatch);
		mFlatfill = desc->mFlatfill;
	}
	S_Sound (CHAN_VOICE | CHAN_UI, desc->mSound, 1.0f, ATTN_NONE);
	if (desc->mPalette.IsNotEmpty() && (lumpnum = Wads.CheckNumForFullName(desc->mPalette, true)) > 0)
	{
		PalEntry *palette;
		const BYTE *orgpal;
		FMemLump lump;
		int i;

		lump = Wads.ReadLump (lumpnum);
		orgpal = (BYTE *)lump.GetMem();
		palette = screen->GetPalette ();
		for (i = 256; i > 0; i--, orgpal += 3)
		{
			*palette++ = PalEntry (orgpal[0], orgpal[1], orgpal[2]);
		}
		screen->UpdatePalette ();
		mPaletteChanged = true;
		NoWipe = 1;
		M_EnableMenu(false);
	}
	mOverlays.Resize(desc->mOverlays.Size());
	for (unsigned i=0; i < mOverlays.Size(); i++)
	{
		mOverlays[i].x = desc->mOverlays[i].x;
		mOverlays[i].y = desc->mOverlays[i].y;
		mOverlays[i].mCondition = desc->mOverlays[i].mCondition;
		mOverlays[i].mPic = TexMan.CheckForTexture(desc->mOverlays[i].mName, FTexture::TEX_MiscPatch);
	}
	mTicker = 0;
}